

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O0

int32_t uprv_compareInvEbcdicAsAscii_63(char *s1,char *s2)

{
  long lVar1;
  uint local_28;
  uint local_24;
  int32_t c2;
  int32_t c1;
  char *s2_local;
  char *s1_local;
  
  _c2 = (byte *)s2;
  s2_local = s1;
  while( true ) {
    local_24 = (uint)(byte)*s2_local;
    local_28 = (uint)*_c2;
    if (local_24 != local_28) {
      if (local_24 != 0) {
        lVar1 = (long)(int)local_24;
        local_24 = (uint)""[lVar1];
        if (((local_24 == 0) || (0x7f < local_24)) ||
           ((invariantChars[(int)local_24 >> 5] & 1 << (""[lVar1] & 0x1f)) == 0)) {
          local_24 = -(uint)(byte)*s2_local;
        }
      }
      if (local_28 != 0) {
        lVar1 = (long)(int)local_28;
        local_28 = (uint)""[lVar1];
        if (((local_28 == 0) || (0x7f < local_28)) ||
           ((invariantChars[(int)local_28 >> 5] & 1 << (""[lVar1] & 0x1f)) == 0)) {
          local_28 = -(uint)*_c2;
        }
      }
      return local_24 - local_28;
    }
    if (local_24 == 0) break;
    s2_local = s2_local + 1;
    _c2 = _c2 + 1;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareInvEbcdicAsAscii(const char *s1, const char *s2) {
    int32_t c1, c2;

    for(;; ++s1, ++s2) {
        c1=(uint8_t)*s1;
        c2=(uint8_t)*s2;
        if(c1!=c2) {
            if(c1!=0 && ((c1=asciiFromEbcdic[c1])==0 || !UCHAR_IS_INVARIANT(c1))) {
                c1=-(int32_t)(uint8_t)*s1;
            }
            if(c2!=0 && ((c2=asciiFromEbcdic[c2])==0 || !UCHAR_IS_INVARIANT(c2))) {
                c2=-(int32_t)(uint8_t)*s2;
            }
            return c1-c2;
        } else if(c1==0) {
            return 0;
        }
    }
}